

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_custom_templates(CompilerMSL *this)

{
  char *pcVar1;
  bool bVar2;
  ExecutionModel EVar3;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  string *param_as;
  size_t param_idx;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string *method_as;
  size_t method_idx;
  SPVFuncImpl *spv_func;
  iterator __end1;
  iterator __begin1;
  set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
  *__range1;
  CompilerMSL *this_local;
  
  __end1 = ::std::
           set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
           ::begin(&this->spv_function_implementations);
  spv_func = (SPVFuncImpl *)
             ::std::
             set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
             ::end(&this->spv_function_implementations);
  while (bVar2 = ::std::operator!=(&__end1,(_Self *)&spv_func), bVar2) {
    method_idx = (size_t)::std::_Rb_tree_const_iterator<spirv_cross::CompilerMSL::SPVFuncImpl>::
                         operator*(&__end1);
    if (*(SPVFuncImpl *)method_idx == SPVFuncImplUnsafeArray) {
      CompilerGLSL::statement<char_const(&)[33]>
                (&this->super_CompilerGLSL,(char (*) [33])"template<typename T, size_t Num>");
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"struct spvUnsafeArray");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[27]>
                (&this->super_CompilerGLSL,(char (*) [27])"T elements[Num ? Num : 1];");
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
      CompilerGLSL::statement<char_const(&)[42]>
                (&this->super_CompilerGLSL,
                 (char (*) [42])"thread T& operator [] (size_t pos) thread");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"constexpr const thread T& operator [] (size_t pos) const thread");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
      CompilerGLSL::statement<char_const(&)[42]>
                (&this->super_CompilerGLSL,
                 (char (*) [42])"device T& operator [] (size_t pos) device");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"constexpr const device T& operator [] (size_t pos) const device");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
      CompilerGLSL::statement<char_const(&)[68]>
                (&this->super_CompilerGLSL,
                 (char (*) [68])
                 "constexpr const constant T& operator [] (size_t pos) const constant");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
      CompilerGLSL::statement<char_const(&)[52]>
                (&this->super_CompilerGLSL,
                 (char (*) [52])"threadgroup T& operator [] (size_t pos) threadgroup");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[74]>
                (&this->super_CompilerGLSL,
                 (char (*) [74])
                 "constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      EVar3 = Compiler::get_execution_model((Compiler *)this);
      if ((EVar3 == ExecutionModelMeshEXT) ||
         (EVar3 = Compiler::get_execution_model((Compiler *)this), EVar3 == ExecutionModelTaskEXT))
      {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
        CompilerGLSL::statement<char_const(&)[52]>
                  (&this->super_CompilerGLSL,
                   (char (*) [52])"object_data T& operator [] (size_t pos) object_data");
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[22]>
                  (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
        CompilerGLSL::end_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[74]>
                  (&this->super_CompilerGLSL,
                   (char (*) [74])
                   "constexpr const object_data T& operator [] (size_t pos) const object_data");
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[22]>
                  (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
        CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      }
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
    }
    else if (*(SPVFuncImpl *)method_idx == SPVFuncImplStorageMatrix) {
      CompilerGLSL::statement<char_const(&)[46]>
                (&this->super_CompilerGLSL,
                 (char (*) [46])"template<typename T, int Cols, int Rows=Cols>");
      CompilerGLSL::statement<char_const(&)[24]>
                (&this->super_CompilerGLSL,(char (*) [24])"struct spvStorageMatrix");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[28]>
                (&this->super_CompilerGLSL,(char (*) [28])"vec<T, Rows> columns[Cols];");
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
      for (method_as = (string *)0x0; method_as < (string *)0x7;
          method_as = (string *)&method_as->field_0x1) {
        if (method_as == (string *)0x4) {
          CompilerGLSL::statement<char_const(&)[28]>
                    (&this->super_CompilerGLSL,(char (*) [28])"#ifdef __HAVE_IMAGEBLOCKS__");
        }
        else if (method_as == (string *)0x5) {
          CompilerGLSL::statement<char_const(&)[27]>
                    (&this->super_CompilerGLSL,(char (*) [27])"#ifdef __HAVE_RAYTRACING__");
        }
        else if (method_as == (string *)0x6) {
          CompilerGLSL::statement<char_const(&)[21]>
                    (&this->super_CompilerGLSL,(char (*) [21])"#ifdef __HAVE_MESH__");
        }
        pcVar1 = emit_custom_templates::address_spaces[(long)method_as];
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
        local_40 = &local_60;
        CompilerGLSL::statement<char_const(&)[20],std::__cxx11::string_const&,char_const(&)[12]>
                  (&this->super_CompilerGLSL,(char (*) [20])"spvStorageMatrix() ",local_40,
                   (char (*) [12])0x5a45e9);
        if (method_as != (string *)0x1) {
          CompilerGLSL::
          statement<std::__cxx11::string_const&,char_const(&)[67],std::__cxx11::string_const&>
                    (&this->super_CompilerGLSL,local_40,
                     (char (*) [67])
                     " spvStorageMatrix& operator=(initializer_list<vec<T, Rows>> cols) ",local_40);
          CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const(&)[10]>
                    (&this->super_CompilerGLSL,(char (*) [10])"size_t i;");
          CompilerGLSL::statement<char_const(&)[26]>
                    (&this->super_CompilerGLSL,(char (*) [26])"thread vec<T, Rows>* col;");
          CompilerGLSL::statement<char_const(&)[54]>
                    (&this->super_CompilerGLSL,
                     (char (*) [54])"for (i = 0, col = cols.begin(); i < Cols; ++i, ++col)");
          CompilerGLSL::statement<char_const(&)[23]>
                    (&this->super_CompilerGLSL,(char (*) [23])"    columns[i] = *col;");
          CompilerGLSL::statement<char_const(&)[14]>
                    (&this->super_CompilerGLSL,(char (*) [14])"return *this;");
          CompilerGLSL::end_scope(&this->super_CompilerGLSL);
        }
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
        for (param_as = (string *)0x0; param_as < (string *)0x7;
            param_as = (string *)&param_as->field_0x1) {
          if (param_as != method_as) {
            if (param_as == (string *)0x4) {
              CompilerGLSL::statement<char_const(&)[28]>
                        (&this->super_CompilerGLSL,(char (*) [28])"#ifdef __HAVE_IMAGEBLOCKS__");
            }
            else if (param_as == (string *)0x5) {
              CompilerGLSL::statement<char_const(&)[27]>
                        (&this->super_CompilerGLSL,(char (*) [27])"#ifdef __HAVE_RAYTRACING__");
            }
            else if (param_as == (string *)0x6) {
              CompilerGLSL::statement<char_const(&)[21]>
                        (&this->super_CompilerGLSL,(char (*) [21])"#ifdef __HAVE_MESH__");
            }
          }
          pcVar1 = emit_custom_templates::address_spaces[(long)param_as];
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          local_88 = &local_a8;
          CompilerGLSL::
          statement<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[28],std::__cxx11::string_const&>
                    (&this->super_CompilerGLSL,(char (*) [24])"spvStorageMatrix(const ",local_88,
                     (char (*) [28])" matrix<T, Cols, Rows>& m) ",local_40);
          CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const(&)[34]>
                    (&this->super_CompilerGLSL,(char (*) [34])"for (size_t i = 0; i < Cols; ++i)");
          CompilerGLSL::statement<char_const(&)[31]>
                    (&this->super_CompilerGLSL,(char (*) [31])"    columns[i] = m.columns[i];");
          CompilerGLSL::end_scope(&this->super_CompilerGLSL);
          CompilerGLSL::
          statement<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[23],std::__cxx11::string_const&,char_const(&)[12]>
                    (&this->super_CompilerGLSL,(char (*) [24])"spvStorageMatrix(const ",local_88,
                     (char (*) [23])" spvStorageMatrix& m) ",local_40,(char (*) [12])0x5a45e9);
          if (method_as != (string *)0x1) {
            CompilerGLSL::
            statement<std::__cxx11::string_const&,char_const(&)[36],std::__cxx11::string_const&,char_const(&)[28],std::__cxx11::string_const&>
                      (&this->super_CompilerGLSL,local_40,
                       (char (*) [36])" spvStorageMatrix& operator=(const ",local_88,
                       (char (*) [28])" matrix<T, Cols, Rows>& m) ",local_40);
            CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
            CompilerGLSL::statement<char_const(&)[34]>
                      (&this->super_CompilerGLSL,(char (*) [34])"for (size_t i = 0; i < Cols; ++i)")
            ;
            CompilerGLSL::statement<char_const(&)[31]>
                      (&this->super_CompilerGLSL,(char (*) [31])"    columns[i] = m.columns[i];");
            CompilerGLSL::statement<char_const(&)[14]>
                      (&this->super_CompilerGLSL,(char (*) [14])"return *this;");
            CompilerGLSL::end_scope(&this->super_CompilerGLSL);
            CompilerGLSL::
            statement<std::__cxx11::string_const&,char_const(&)[36],std::__cxx11::string_const&,char_const(&)[23],std::__cxx11::string_const&,char_const(&)[12]>
                      (&this->super_CompilerGLSL,local_40,
                       (char (*) [36])" spvStorageMatrix& operator=(const ",local_88,
                       (char (*) [23])" spvStorageMatrix& m) ",local_40,(char (*) [12])0x5a45e9);
          }
          if ((param_as != method_as) && ((string *)0x3 < param_as)) {
            CompilerGLSL::statement<char_const(&)[7]>
                      (&this->super_CompilerGLSL,(char (*) [7])0x564153);
          }
          CompilerGLSL::statement<char_const(&)[1]>
                    (&this->super_CompilerGLSL,(char (*) [1])0x563e71);
          ::std::__cxx11::string::~string((string *)&local_a8);
        }
        CompilerGLSL::statement<char_const(&)[40],std::__cxx11::string_const&>
                  (&this->super_CompilerGLSL,
                   (char (*) [40])"operator matrix<T, Cols, Rows>() const ",local_40);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[25]>
                  (&this->super_CompilerGLSL,(char (*) [25])"matrix<T, Cols, Rows> m;");
        CompilerGLSL::statement<char_const(&)[31]>
                  (&this->super_CompilerGLSL,(char (*) [31])"for (int i = 0; i < Cols; ++i)");
        CompilerGLSL::statement<char_const(&)[31]>
                  (&this->super_CompilerGLSL,(char (*) [31])"    m.columns[i] = columns[i];");
        CompilerGLSL::statement<char_const(&)[10]>
                  (&this->super_CompilerGLSL,(char (*) [10])"return m;");
        CompilerGLSL::end_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
        CompilerGLSL::statement<char_const(&)[43],std::__cxx11::string_const&>
                  (&this->super_CompilerGLSL,
                   (char (*) [43])"vec<T, Rows> operator[](size_t idx) const ",local_40);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[21]>
                  (&this->super_CompilerGLSL,(char (*) [21])"return columns[idx];");
        CompilerGLSL::end_scope(&this->super_CompilerGLSL);
        if (method_as != (string *)0x1) {
          CompilerGLSL::
          statement<std::__cxx11::string_const&,char_const(&)[39],std::__cxx11::string_const&>
                    (&this->super_CompilerGLSL,local_40,
                     (char (*) [39])" vec<T, Rows>& operator[](size_t idx) ",local_40);
          CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
          CompilerGLSL::statement<char_const(&)[21]>
                    (&this->super_CompilerGLSL,(char (*) [21])"return columns[idx];");
          CompilerGLSL::end_scope(&this->super_CompilerGLSL);
        }
        if ((string *)0x3 < method_as) {
          CompilerGLSL::statement<char_const(&)[7]>
                    (&this->super_CompilerGLSL,(char (*) [7])0x564153);
        }
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
        ::std::__cxx11::string::~string((string *)&local_60);
      }
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
      CompilerGLSL::statement<char_const(&)[41]>
                (&this->super_CompilerGLSL,(char (*) [41])"template<typename T, int Cols, int Rows>"
                );
      CompilerGLSL::statement<char_const(&)[67]>
                (&this->super_CompilerGLSL,
                 (char (*) [67])"matrix<T, Rows, Cols> transpose(spvStorageMatrix<T, Cols, Rows> m)"
                );
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[44]>
                (&this->super_CompilerGLSL,
                 (char (*) [44])"return transpose(matrix<T, Cols, Rows>(m));");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 2, 2> spvStorage_half2x2;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 2, 3> spvStorage_half2x3;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 2, 4> spvStorage_half2x4;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 3, 2> spvStorage_half3x2;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 3, 3> spvStorage_half3x3;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 3, 4> spvStorage_half3x4;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 4, 2> spvStorage_half4x2;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 4, 3> spvStorage_half4x3;");
      CompilerGLSL::statement<char_const(&)[57]>
                (&this->super_CompilerGLSL,
                 (char (*) [57])"typedef spvStorageMatrix<half, 4, 4> spvStorage_half4x4;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 2, 2> spvStorage_float2x2;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 2, 3> spvStorage_float2x3;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 2, 4> spvStorage_float2x4;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 3, 2> spvStorage_float3x2;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 3, 3> spvStorage_float3x3;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 3, 4> spvStorage_float3x4;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 4, 2> spvStorage_float4x2;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 4, 3> spvStorage_float4x3;");
      CompilerGLSL::statement<char_const(&)[59]>
                (&this->super_CompilerGLSL,
                 (char (*) [59])"typedef spvStorageMatrix<float, 4, 4> spvStorage_float4x4;");
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x563e71);
    }
    ::std::_Rb_tree_const_iterator<spirv_cross::CompilerMSL::SPVFuncImpl>::operator++(&__end1);
  }
  return;
}

Assistant:

void CompilerMSL::emit_custom_templates()
{
	static const char * const address_spaces[] = {
		"thread", "constant", "device", "threadgroup", "threadgroup_imageblock", "ray_data", "object_data"
	};

	for (const auto &spv_func : spv_function_implementations)
	{
		switch (spv_func)
		{
		case SPVFuncImplUnsafeArray:
			statement("template<typename T, size_t Num>");
			statement("struct spvUnsafeArray");
			begin_scope();
			statement("T elements[Num ? Num : 1];");
			statement("");
			statement("thread T& operator [] (size_t pos) thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const thread T& operator [] (size_t pos) const thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("device T& operator [] (size_t pos) device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const device T& operator [] (size_t pos) const device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("constexpr const constant T& operator [] (size_t pos) const constant");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("threadgroup T& operator [] (size_t pos) threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			if (get_execution_model() == spv::ExecutionModelMeshEXT ||
			    get_execution_model() == spv::ExecutionModelTaskEXT)
			{
				statement("");
				statement("object_data T& operator [] (size_t pos) object_data");
				begin_scope();
				statement("return elements[pos];");
				end_scope();
				statement("constexpr const object_data T& operator [] (size_t pos) const object_data");
				begin_scope();
				statement("return elements[pos];");
				end_scope();
			}
			end_scope_decl();
			statement("");
			break;

		case SPVFuncImplStorageMatrix:
			statement("template<typename T, int Cols, int Rows=Cols>");
			statement("struct spvStorageMatrix");
			begin_scope();
			statement("vec<T, Rows> columns[Cols];");
			statement("");
			for (size_t method_idx = 0; method_idx < sizeof(address_spaces) / sizeof(address_spaces[0]); ++method_idx)
			{
				// Some address spaces require particular features.
				if (method_idx == 4) // threadgroup_imageblock
					statement("#ifdef __HAVE_IMAGEBLOCKS__");
				else if (method_idx == 5) // ray_data
					statement("#ifdef __HAVE_RAYTRACING__");
				else if (method_idx == 6) // object_data
					statement("#ifdef __HAVE_MESH__");
				const string &method_as = address_spaces[method_idx];
				statement("spvStorageMatrix() ", method_as, " = default;");
				if (method_idx != 1) // constant
				{
					statement(method_as, " spvStorageMatrix& operator=(initializer_list<vec<T, Rows>> cols) ",
					          method_as);
					begin_scope();
					statement("size_t i;");
					statement("thread vec<T, Rows>* col;");
					statement("for (i = 0, col = cols.begin(); i < Cols; ++i, ++col)");
					statement("    columns[i] = *col;");
					statement("return *this;");
					end_scope();
				}
				statement("");
				for (size_t param_idx = 0; param_idx < sizeof(address_spaces) / sizeof(address_spaces[0]); ++param_idx)
				{
					if (param_idx != method_idx)
					{
						if (param_idx == 4) // threadgroup_imageblock
							statement("#ifdef __HAVE_IMAGEBLOCKS__");
						else if (param_idx == 5) // ray_data
							statement("#ifdef __HAVE_RAYTRACING__");
						else if (param_idx == 6) // object_data
							statement("#ifdef __HAVE_MESH__");
					}
					const string &param_as = address_spaces[param_idx];
					statement("spvStorageMatrix(const ", param_as, " matrix<T, Cols, Rows>& m) ", method_as);
					begin_scope();
					statement("for (size_t i = 0; i < Cols; ++i)");
					statement("    columns[i] = m.columns[i];");
					end_scope();
					statement("spvStorageMatrix(const ", param_as, " spvStorageMatrix& m) ", method_as, " = default;");
					if (method_idx != 1) // constant
					{
						statement(method_as, " spvStorageMatrix& operator=(const ", param_as,
						          " matrix<T, Cols, Rows>& m) ", method_as);
						begin_scope();
						statement("for (size_t i = 0; i < Cols; ++i)");
						statement("    columns[i] = m.columns[i];");
						statement("return *this;");
						end_scope();
						statement(method_as, " spvStorageMatrix& operator=(const ", param_as, " spvStorageMatrix& m) ",
						          method_as, " = default;");
					}
					if (param_idx != method_idx && param_idx >= 4)
						statement("#endif");
					statement("");
				}
				statement("operator matrix<T, Cols, Rows>() const ", method_as);
				begin_scope();
				statement("matrix<T, Cols, Rows> m;");
				statement("for (int i = 0; i < Cols; ++i)");
				statement("    m.columns[i] = columns[i];");
				statement("return m;");
				end_scope();
				statement("");
				statement("vec<T, Rows> operator[](size_t idx) const ", method_as);
				begin_scope();
				statement("return columns[idx];");
				end_scope();
				if (method_idx != 1) // constant
				{
					statement(method_as, " vec<T, Rows>& operator[](size_t idx) ", method_as);
					begin_scope();
					statement("return columns[idx];");
					end_scope();
				}
				if (method_idx >= 4)
					statement("#endif");
				statement("");
			}
			end_scope_decl();
			statement("");
			statement("template<typename T, int Cols, int Rows>");
			statement("matrix<T, Rows, Cols> transpose(spvStorageMatrix<T, Cols, Rows> m)");
			begin_scope();
			statement("return transpose(matrix<T, Cols, Rows>(m));");
			end_scope();
			statement("");
			statement("typedef spvStorageMatrix<half, 2, 2> spvStorage_half2x2;");
			statement("typedef spvStorageMatrix<half, 2, 3> spvStorage_half2x3;");
			statement("typedef spvStorageMatrix<half, 2, 4> spvStorage_half2x4;");
			statement("typedef spvStorageMatrix<half, 3, 2> spvStorage_half3x2;");
			statement("typedef spvStorageMatrix<half, 3, 3> spvStorage_half3x3;");
			statement("typedef spvStorageMatrix<half, 3, 4> spvStorage_half3x4;");
			statement("typedef spvStorageMatrix<half, 4, 2> spvStorage_half4x2;");
			statement("typedef spvStorageMatrix<half, 4, 3> spvStorage_half4x3;");
			statement("typedef spvStorageMatrix<half, 4, 4> spvStorage_half4x4;");
			statement("typedef spvStorageMatrix<float, 2, 2> spvStorage_float2x2;");
			statement("typedef spvStorageMatrix<float, 2, 3> spvStorage_float2x3;");
			statement("typedef spvStorageMatrix<float, 2, 4> spvStorage_float2x4;");
			statement("typedef spvStorageMatrix<float, 3, 2> spvStorage_float3x2;");
			statement("typedef spvStorageMatrix<float, 3, 3> spvStorage_float3x3;");
			statement("typedef spvStorageMatrix<float, 3, 4> spvStorage_float3x4;");
			statement("typedef spvStorageMatrix<float, 4, 2> spvStorage_float4x2;");
			statement("typedef spvStorageMatrix<float, 4, 3> spvStorage_float4x3;");
			statement("typedef spvStorageMatrix<float, 4, 4> spvStorage_float4x4;");
			statement("");
			break;

		default:
			break;
		}
	}
}